

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_truncated_poisson_dist.hpp
# Opt level: O1

basic_ostream<char,_std::char_traits<char>_> *
trng::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,zero_truncated_poisson_dist *g)

{
  undefined4 uVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  char local_19;
  
  uVar1 = *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = 0x26;
  std::__ostream_insert<char,std::char_traits<char>>(out,"[zero-truncated poisson ",0x18);
  pbVar2 = operator<<(out,&g->P);
  local_19 = ']';
  std::__ostream_insert<char,std::char_traits<char>>(pbVar2,&local_19,1);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
  return out;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(std::basic_ostream<char_t, traits_t> &out,
                                                   const zero_truncated_poisson_dist &g) {
    std::ios_base::fmtflags flags(out.flags());
    out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
    out << "[zero-truncated poisson " << g.param() << ']';
    out.flags(flags);
    return out;
  }